

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O3

bool __thiscall SightCheck::P_SightTraverseIntercepts(SightCheck *this)

{
  long *plVar1;
  AActor *pAVar2;
  extsector_t *peVar3;
  double *pdVar4;
  double dVar5;
  bool bVar6;
  ulong uVar7;
  intercept_t *piVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  intercept_t *piVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  divline_t local_58;
  
  if (intercepts.Count != 0) {
    lVar11 = 0;
    uVar10 = 0;
    uVar9 = intercepts.Count;
    do {
      piVar12 = intercepts.Array;
      plVar1 = *(long **)((long)&(intercepts.Array)->d + lVar11);
      local_58.x = *(double *)*plVar1;
      local_58.y = ((double *)*plVar1)[1];
      local_58.dx = (double)plVar1[2];
      local_58.dy = (double)plVar1[3];
      dVar15 = P_InterceptVector(&this->Trace,&local_58);
      *(double *)((long)&piVar12->frac + lVar11) = dVar15;
      if (dVar15 < this->Startfrac) {
        *(undefined8 *)((long)&piVar12->frac + lVar11) = 0x41dfffffffc00000;
        uVar9 = uVar9 - 1;
      }
      uVar10 = uVar10 + 1;
      uVar7 = (ulong)intercepts.Count;
      lVar11 = lVar11 + 0x18;
    } while (uVar10 < uVar7);
    if (uVar9 != 0) {
      piVar12 = (intercept_t *)0x0;
      do {
        if ((int)uVar7 != 0) {
          uVar13 = 0xffc00000;
          uVar14 = 0x41dfffff;
          piVar8 = intercepts.Array;
          uVar10 = uVar7;
          do {
            dVar15 = piVar8->frac;
            if (dVar15 <= (double)CONCAT44(uVar14,uVar13) &&
                (double)CONCAT44(uVar14,uVar13) != dVar15) {
              piVar12 = piVar8;
            }
            if ((double)CONCAT44(uVar14,uVar13) <= dVar15) {
              dVar15 = (double)CONCAT44(uVar14,uVar13);
            }
            piVar8 = piVar8 + 1;
            uVar13 = SUB84(dVar15,0);
            uVar14 = (undefined4)((ulong)dVar15 >> 0x20);
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
        }
        if (piVar12 != (intercept_t *)0x0) {
          bVar6 = PTR_SightTraverse(this,piVar12);
          if (!bVar6) {
            return false;
          }
          uVar7 = (ulong)intercepts.Count;
          piVar12->frac = 2147483647.0;
        }
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
  }
  pAVar2 = this->seeingthing;
  if (this->lastsector == (sector_t_conflict *)pAVar2->Sector) {
    peVar3 = this->lastsector->e;
    uVar10 = (ulong)(peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    if (uVar10 != 0) {
      dVar15 = (this->sightstart).Z;
      dVar16 = this->topslope + dVar15;
      dVar15 = dVar15 + this->bottomslope;
      lVar11 = 0;
      do {
        plVar1 = *(long **)((long)(peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                                  Array + lVar11);
        uVar9 = *(uint *)(plVar1 + 0xb) & 2;
        if (((uVar9 != this->myseethrough) && ((*(uint *)(plVar1 + 0xb) & 1) != 0)) &&
           ((uVar9 == 0 & (byte)((this->Flags & 8U) >> 3)) == 0)) {
          pdVar4 = (double *)*plVar1;
          dVar17 = (pAVar2->__Pos).X;
          dVar5 = (pAVar2->__Pos).Y;
          dVar18 = (pdVar4[1] * dVar5 + pdVar4[3] + *pdVar4 * dVar17) * pdVar4[4];
          if (((this->Lastztop <= dVar18) && (dVar18 < dVar16)) &&
             ((this->Lastzbottom <= dVar18 && (dVar18 < dVar15)))) {
            return false;
          }
          pdVar4 = (double *)plVar1[5];
          dVar17 = (dVar5 * pdVar4[1] + pdVar4[3] + dVar17 * *pdVar4) * pdVar4[4];
          if (((dVar17 <= this->Lastztop) && (dVar17 <= this->Lastzbottom)) &&
             ((dVar15 < dVar17 && (dVar16 < dVar17)))) {
            return false;
          }
        }
        lVar11 = lVar11 + 8;
      } while (uVar10 << 3 != lVar11);
    }
  }
  return true;
}

Assistant:

bool SightCheck::P_SightTraverseIntercepts ()
{
	unsigned count;
	double dist;
	intercept_t *scan, *in;
	unsigned scanpos;
	divline_t dl;

	count = intercepts.Size ();
//
// calculate intercept distance
//
	for (scanpos = 0; scanpos < intercepts.Size (); scanpos++)
	{
		scan = &intercepts[scanpos];
		P_MakeDivline (scan->d.line, &dl);
		scan->frac = P_InterceptVector (&Trace, &dl);
		if (scan->frac < Startfrac)
		{
			scan->frac = INT_MAX;
			count--;
		}
	}

//
// go through in order
// proper order is needed to handle 3D floors and portals.
//
	in = NULL;

	while (count--)
	{
		dist = INT_MAX;
		for (scanpos = 0; scanpos < intercepts.Size (); scanpos++)
		{
			scan = &intercepts[scanpos];
			if (scan->frac < dist)
			{
				dist = scan->frac;
				in = scan;
			}
		}

		if (in != NULL)
		{
			if (!PTR_SightTraverse (in))
				return false;					// don't bother going farther
			in->frac = INT_MAX;
		}
	}

	if (lastsector == seeingthing->Sector && lastsector->e->XFloor.ffloors.Size())
	{
		// we must do one last check whether the trace has crossed a 3D floor in the last sector

		double topz = topslope + sightstart.Z;
		double bottomz = bottomslope + sightstart.Z;

		for (auto rover : lastsector->e->XFloor.ffloors)
		{
			if ((rover->flags & FF_SOLID) == myseethrough || !(rover->flags & FF_EXISTS)) continue;
			if ((Flags & SF_IGNOREWATERBOUNDARY) && (rover->flags & FF_SOLID) == 0) continue;

			double ff_bottom = rover->bottom.plane->ZatPoint(seeingthing);
			double ff_top = rover->top.plane->ZatPoint(seeingthing);

			if (Lastztop <= ff_bottom && topz > ff_bottom && Lastzbottom <= ff_bottom && bottomz > ff_bottom) return false;
			if (Lastzbottom >= ff_top && bottomz < ff_top && Lastztop >= ff_top && topz < ff_top) return false;
		}
	}
	return true;			// everything was traversed
}